

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedAllStagesOneImage::Run(AdvancedAllStagesOneImage *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint in_EAX;
  GLuint program;
  GLint GVar2;
  long lVar3;
  GLuint ui32;
  GLint i32;
  
  ui32 = in_EAX;
  bVar1 = ShaderImageLoadStoreBase::SupportedInGeomStages(&this->super_ShaderImageLoadStoreBase,2);
  lVar3 = 0x10;
  if (bVar1) {
    program = ShaderImageLoadStoreBase::BuildProgram
                        (&this->super_ShaderImageLoadStoreBase,
                         "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(r32i) coherent uniform iimageBuffer g_buffer;\nlayout(r32ui) coherent uniform uimage2D g_image;\nvoid main() {\n  gl_Position = i_position + vec4(1.0, 1.0, 0.0, 0.0);\n  imageAtomicAdd(g_buffer, 0, 1);\n  imageAtomicAdd(g_image, ivec2(0, 0), 2u);\n}"
                         ,
                         "#version 420 core\nlayout(vertices = 1) out;\nlayout(r32i) coherent uniform iimageBuffer g_buffer;\nlayout(r32ui) coherent uniform uimage2D g_image;\nvoid main() {\n  gl_out[gl_InvocationID].gl_Position = gl_in[0].gl_Position;\n  gl_TessLevelInner[0] = 1.0;\n  gl_TessLevelInner[1] = 1.0;\n  gl_TessLevelOuter[0] = 1.0;\n  gl_TessLevelOuter[1] = 1.0;\n  gl_TessLevelOuter[2] = 1.0;\n  gl_TessLevelOuter[3] = 1.0;\n  imageAtomicAdd(g_buffer, 0, 1);\n  imageAtomicAdd(g_image, ivec2(0, 0), 2u);\n}"
                         ,
                         "#version 420 core\nlayout(triangles, point_mode) in;\nlayout(r32i) coherent uniform iimageBuffer g_buffer;\nlayout(r32ui) coherent uniform uimage2D g_image;\nvoid main() {\n  imageAtomicAdd(g_buffer, 0, 1);\n  imageAtomicAdd(g_image, ivec2(0, 0), 2u);\n  gl_Position = gl_in[0].gl_Position;\n}"
                         ,
                         "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(r32i) coherent uniform iimageBuffer g_buffer;\nlayout(r32ui) coherent uniform uimage2D g_image;\nvoid main() {\n  imageAtomicAdd(g_buffer, 0, 1);\n  imageAtomicAdd(g_image, ivec2(0, 0), 2u);\n  gl_Position = gl_in[0].gl_Position;\n  EmitVertex();\n}"
                         ,
                         "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(r32i) coherent uniform iimageBuffer g_buffer;\nlayout(r32ui) coherent uniform uimage2D g_image;\nvoid main() {\n  imageAtomicAdd(g_buffer, 0, 1);\n  imageAtomicAdd(g_image, ivec2(0, 0), 2u);\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
                         ,(bool *)0x0);
    this->m_program = program;
    this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,program);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_buffer");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,0);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_image");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,1);
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,&this->m_ebo);
    _ui32 = (ulong)ui32;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8c2a,4,&i32,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_buffer_tex);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8235,this->m_buffer);
    glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
    _ui32 = _ui32 & 0xffffffff00000000;
    glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x8236,1,1,0,0x8d94,0x1405,&ui32);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8235);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture,0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
    glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
    glu::CallLogWrapper::glDrawElementsInstancedBaseVertex(this_00,0xe,1,0x1403,(void *)0x0,1,0);
    glu::CallLogWrapper::glDrawElementsInstanced(this_00,0xe,1,0x1403,(void *)0x0,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x8c2a,0,4,&i32);
    if (i32 - 0x33U < 0xffffffe1) {
      anon_unknown_0::Output("Buffer value is %d should be in the range [20;50]");
    }
    else {
      glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
      glu::CallLogWrapper::glGetTexImage(this_00,0xde1,0,0x8d94,0x1405,&ui32);
      if (0x27 < ui32 && ui32 == i32 * 2) {
        return 0;
      }
      anon_unknown_0::Output("Texture value is %d should be %d");
    }
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInGeomStages(2))
			return NOT_SUPPORTED;
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(r32i) coherent uniform iimageBuffer g_buffer;" NL
			"layout(r32ui) coherent uniform uimage2D g_image;" NL "void main() {" NL
			"  gl_Position = i_position + vec4(1.0, 1.0, 0.0, 0.0);" NL "  imageAtomicAdd(g_buffer, 0, 1);" NL
			"  imageAtomicAdd(g_image, ivec2(0, 0), 2u);" NL "}";
		const char* const glsl_tcs =
			"#version 420 core" NL "layout(vertices = 1) out;" NL
			"layout(r32i) coherent uniform iimageBuffer g_buffer;" NL
			"layout(r32ui) coherent uniform uimage2D g_image;" NL "void main() {" NL
			"  gl_out[gl_InvocationID].gl_Position = gl_in[0].gl_Position;" NL "  gl_TessLevelInner[0] = 1.0;" NL
			"  gl_TessLevelInner[1] = 1.0;" NL "  gl_TessLevelOuter[0] = 1.0;" NL "  gl_TessLevelOuter[1] = 1.0;" NL
			"  gl_TessLevelOuter[2] = 1.0;" NL "  gl_TessLevelOuter[3] = 1.0;" NL "  imageAtomicAdd(g_buffer, 0, 1);" NL
			"  imageAtomicAdd(g_image, ivec2(0, 0), 2u);" NL "}";
		const char* const glsl_tes =
			"#version 420 core" NL "layout(triangles, point_mode) in;" NL
			"layout(r32i) coherent uniform iimageBuffer g_buffer;" NL
			"layout(r32ui) coherent uniform uimage2D g_image;" NL "void main() {" NL
			"  imageAtomicAdd(g_buffer, 0, 1);" NL "  imageAtomicAdd(g_image, ivec2(0, 0), 2u);" NL
			"  gl_Position = gl_in[0].gl_Position;" NL "}";
		const char* const glsl_gs =
			"#version 420 core" NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL
			"layout(r32i) coherent uniform iimageBuffer g_buffer;" NL
			"layout(r32ui) coherent uniform uimage2D g_image;" NL "void main() {" NL
			"  imageAtomicAdd(g_buffer, 0, 1);" NL "  imageAtomicAdd(g_image, ivec2(0, 0), 2u);" NL
			"  gl_Position = gl_in[0].gl_Position;" NL "  EmitVertex();" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(r32i) coherent uniform iimageBuffer g_buffer;" NL
			"layout(r32ui) coherent uniform uimage2D g_image;" NL "void main() {" NL
			"  imageAtomicAdd(g_buffer, 0, 1);" NL "  imageAtomicAdd(g_image, ivec2(0, 0), 2u);" NL
			"  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_program = BuildProgram(glsl_vs, glsl_tcs, glsl_tes, glsl_gs, glsl_fs);
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image"), 1);

		CreateFullViewportQuad(&m_vao, &m_vbo, &m_ebo);

		GLint i32 = 0;
		glGenBuffers(1, &m_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, 4, &i32, GL_STATIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_R32I, m_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		GLuint ui32 = 0;
		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, 1, 1, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, &ui32);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32I);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);

		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);

		glDrawElementsInstancedBaseVertex(GL_PATCHES, 1, GL_UNSIGNED_SHORT, 0, 1, 0);
		glDrawElementsInstanced(GL_PATCHES, 1, GL_UNSIGNED_SHORT, 0, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, 4, &i32);
		if (i32 < 20 || i32 > 50)
		{
			Output("Buffer value is %d should be in the range [20;50]", i32);
			return ERROR;
		}

		glBindTexture(GL_TEXTURE_2D, m_texture);
		glGetTexImage(GL_TEXTURE_2D, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, &ui32);
		if (ui32 < 40 || ui32 != static_cast<GLuint>(2 * i32))
		{
			Output("Texture value is %d should be %d", ui32, 2 * i32);
			return ERROR;
		}

		return NO_ERROR;
	}